

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  internal *this;
  TestPartResult *this_00;
  char *pcVar6;
  TimeInMillis ms;
  String local_c8;
  String message;
  TestPartResult *part;
  int i;
  int failures;
  undefined1 local_78 [16];
  string local_68;
  XmlUnitTestResultPrinter local_38;
  TestResult *result;
  TestInfo *test_info_local;
  char *test_case_name_local;
  ostream *stream_local;
  
  result = (TestResult *)test_info;
  test_info_local = (TestInfo *)test_case_name;
  test_case_name_local = (char *)stream;
  local_38.output_file_.length_ = (size_t)TestInfo::result(test_info);
  poVar4 = std::operator<<((ostream *)test_case_name_local,"    <testcase name=\"");
  pcVar5 = TestInfo::name((TestInfo *)result);
  EscapeXmlAttribute(&local_38,pcVar5);
  pcVar5 = String::c_str((String *)&local_38);
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4,"\" status=\"");
  bVar1 = TestInfo::should_run((TestInfo *)result);
  pcVar5 = "notrun";
  if (bVar1) {
    pcVar5 = "run";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4,"\" time=\"");
  this = (internal *)TestResult::elapsed_time((TestResult *)local_38.output_file_.length_);
  FormatTimeInMillisAsSeconds_abi_cxx11_((string *)(local_78 + 0x10),this,ms);
  poVar4 = std::operator<<(poVar4,(string *)(local_78 + 0x10));
  poVar4 = std::operator<<(poVar4,"\" classname=\"");
  EscapeXmlAttribute((XmlUnitTestResultPrinter *)local_78,(char *)test_info_local);
  pcVar5 = String::c_str((String *)local_78);
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4,"\"");
  TestPropertiesAsXmlAttributes
            ((XmlUnitTestResultPrinter *)&i,(TestResult *)local_38.output_file_.length_);
  pcVar5 = String::c_str((String *)&i);
  std::operator<<(poVar4,pcVar5);
  String::~String((String *)&i);
  String::~String((String *)local_78);
  std::__cxx11::string::~string((string *)(local_78 + 0x10));
  String::~String((String *)&local_38);
  part._4_4_ = 0;
  for (part._0_4_ = 0;
      iVar2 = TestResult::total_part_count((TestResult *)local_38.output_file_.length_),
      (int)part < iVar2; part._0_4_ = (int)part + 1) {
    this_00 = TestResult::GetTestPartResult((TestResult *)local_38.output_file_.length_,(int)part);
    bVar1 = TestPartResult::failed(this_00);
    if (bVar1) {
      part._4_4_ = part._4_4_ + 1;
      if (part._4_4_ == 1) {
        std::operator<<((ostream *)test_case_name_local,">\n");
      }
      poVar4 = std::operator<<((ostream *)test_case_name_local,"      <failure message=\"");
      pcVar5 = TestPartResult::summary(this_00);
      EscapeXmlAttribute((XmlUnitTestResultPrinter *)&message.length_,pcVar5);
      pcVar5 = String::c_str((String *)&message.length_);
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::operator<<(poVar4,"\" type=\"\">");
      String::~String((String *)&message.length_);
      pcVar5 = TestPartResult::file_name(this_00);
      uVar3 = TestPartResult::line_number(this_00);
      pcVar6 = TestPartResult::message(this_00);
      String::Format(&local_c8,"%s:%d\n%s",pcVar5,(ulong)uVar3,pcVar6);
      pcVar5 = String::c_str(&local_c8);
      RemoveInvalidXmlCharacters((XmlUnitTestResultPrinter *)&stack0xffffffffffffff48,pcVar5);
      String::~String(&local_c8);
      pcVar5 = test_case_name_local;
      pcVar6 = String::c_str((String *)&stack0xffffffffffffff48);
      OutputXmlCDataSection((ostream *)pcVar5,pcVar6);
      std::operator<<((ostream *)test_case_name_local,"</failure>\n");
      String::~String((String *)&stack0xffffffffffffff48);
    }
  }
  if (part._4_4_ == 0) {
    std::operator<<((ostream *)test_case_name_local," />\n");
  }
  else {
    std::operator<<((ostream *)test_case_name_local,"    </testcase>\n");
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  *stream << "    <testcase name=\""
          << EscapeXmlAttribute(test_info.name()).c_str()
          << "\" status=\""
          << (test_info.should_run() ? "run" : "notrun")
          << "\" time=\""
          << FormatTimeInMillisAsSeconds(result.elapsed_time())
          << "\" classname=\"" << EscapeXmlAttribute(test_case_name).c_str()
          << "\"" << TestPropertiesAsXmlAttributes(result).c_str();

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1)
        *stream << ">\n";
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(part.summary()).c_str()
              << "\" type=\"\">";
      const String message = RemoveInvalidXmlCharacters(String::Format(
          "%s:%d\n%s",
          part.file_name(), part.line_number(),
          part.message()).c_str());
      OutputXmlCDataSection(stream, message.c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}